

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  stbi__context *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  iVar1 = stbi__png_is16(s);
  if (iVar1 == 0) {
    iVar1 = stbi__psd_is16(in_stack_ffffffffffffffe8);
    if (iVar1 == 0) {
      iVar1 = stbi__pnm_is16(in_stack_ffffffffffffffe8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_is16(s))  return 1;
   #endif
   return 0;
}